

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O1

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  void *__ptr;
  long lVar1;
  
  if (vMasterBarrierDisjunctsArg != (Vec_Ptr_t *)0x0) {
    if (0 < vMasterBarrierDisjunctsArg->nSize) {
      lVar1 = 0;
      do {
        __ptr = vMasterBarrierDisjunctsArg->pArray[lVar1];
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < vMasterBarrierDisjunctsArg->nSize);
    }
    if (vMasterBarrierDisjunctsArg->pArray != (void **)0x0) {
      free(vMasterBarrierDisjunctsArg->pArray);
      vMasterBarrierDisjunctsArg->pArray = (void **)0x0;
    }
    free(vMasterBarrierDisjunctsArg);
    return;
  }
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	int i;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Int_t *, vMasterBarrierDisjunctsArg, vInt, i)
		{	
			Vec_IntFree(vInt);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}